

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O3

void __thiscall dlib::logger::logger(logger *this,string *name_)

{
  string *name;
  binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>
  *this_00;
  pointer pcVar1;
  node *pnVar2;
  bool bVar3;
  global_data *pgVar4;
  streambuf *psVar5;
  unsigned_long uVar6;
  node *pnVar7;
  print_header_type p_Var8;
  logger *temp;
  auto_mutex M;
  logger *local_98;
  auto_mutex local_90;
  mfp_kernel_1_base_class<4UL> local_78;
  
  this->_vptr_logger = (_func_int **)&PTR__logger_0030ff80;
  pgVar4 = get_global_data();
  this->gd = pgVar4;
  name = &this->logger_name;
  (this->logger_name)._M_dataplus._M_p = (pointer)&(this->logger_name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)name,pcVar1,pcVar1 + name_->_M_string_length);
  psVar5 = global_data::output_streambuf(this->gd,name);
  std::ostream::ostream(&this->out,psVar5);
  global_data::level(&this->cur_level,this->gd,name);
  (this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.data = &this->hook;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 8) = 0;
  *(undefined4 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x10) = 2;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x18) = 0;
  *(undefined8 *)((long)&(this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem + 0x20) = 0;
  (this->hook).super_mfp_kernel_1_base_class<4UL>.mp_memory.mem.void_ptr =
       &PTR__mp_base_base_0030ffb0;
  local_90.r = &this->gd->m;
  local_90.m = (mutex *)0x0;
  local_90.rw = (read_write_mutex *)0x0;
  rmutex::lock(local_90.r,1);
  pgVar4 = this->gd;
  this_00 = &(pgVar4->loggers).bst;
  local_98 = this;
  if ((pgVar4->loggers).bst.tree_size == 0) {
    pnVar7 = (node *)operator_new(0x28);
    (pgVar4->loggers).bst.tree_root = pnVar7;
    pnVar7->color = '\x01';
    pnVar2 = (pgVar4->loggers).bst.NIL;
    pnVar7->left = pnVar2;
    pnVar7->right = pnVar2;
    pnVar7->parent = pnVar2;
    pnVar7->d = this;
    pnVar7->r = (pgVar4->loggers).junk;
    uVar6 = 1;
  }
  else {
    binary_search_tree_kernel_2<dlib::logger_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::logger_*>_>
    ::add_to_tree(this_00,(pgVar4->loggers).bst.tree_root,&local_98,&(pgVar4->loggers).junk);
    uVar6 = (pgVar4->loggers).bst.tree_size + 1;
  }
  (pgVar4->loggers).bst.tree_size = uVar6;
  (*(pgVar4->loggers).bst.super_enumerable<dlib::map_pair<dlib::logger_*,_char>_>._vptr_enumerable
    [3])(this_00);
  p_Var8 = global_data::logger_header(this->gd,name);
  this->print_header = p_Var8;
  bVar3 = global_data::auto_flush(this->gd,name);
  this->auto_flush_enabled = bVar3;
  global_data::output_hook((hook_mfp *)&local_78,this->gd,name);
  mfp_kernel_1_base_class<4UL>::operator=
            (&(this->hook).super_mfp_kernel_1_base_class<4UL>,&local_78);
  (*(code *)**local_78.mp_memory.data)();
  auto_mutex::unlock(&local_90);
  return;
}

Assistant:

logger::
    logger (  
        const std::string& name_
    ) : 
        gd(get_global_data()),
        logger_name(name_),
        out(gd.output_streambuf(logger_name)),
        cur_level(gd.level(logger_name))
    {
        DLIB_ASSERT(name_[0] != '\0',
                    "\tlogger::logger()"
                    << "\n\tYou can't make a logger with an empty name"
                    << "\n\tthis: " << this
        );

        auto_mutex M(gd.m);
        logger* temp = this;
        gd.loggers.add(temp);

        // load the appropriate settings
        print_header        = gd.logger_header(logger_name);
        auto_flush_enabled  = gd.auto_flush(logger_name);
        hook                = gd.output_hook(logger_name);
    }